

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O1

void reach(system_declaration_t *sysdecl)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  bool *pbVar4;
  concrete_cex_t *cex;
  runtime_error *prVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  tuple<tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
  local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  tchecker::tck_reach::zg_reach::run
            (&local_98,sysdecl,&labels_abi_cxx11_,&search_order_abi_cxx11_,block_size,table_size);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  tchecker::algorithms::reach::stats_t::attributes
            (&local_98.
              super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
              .super__Head_base<0UL,_tchecker::algorithms::reach::stats_t,_false>._M_head_impl,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,*(char **)(p_Var3 + 2),(long)p_Var3[2]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (certificate == CERTIFICATE_GRAPH) {
    tchecker::tck_reach::zg_reach::dot_output
              (os,local_98.
                  super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                  .super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>.
                  super__Head_base<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>,_false>
                  ._M_head_impl.
                  super___shared_ptr<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&sysdecl->_name);
  }
  else {
    if ((certificate == CERTIFICATE_CONCRETE) &&
       (pbVar4 = tchecker::algorithms::reach::stats_t::reachable
                           (&local_98.
                             super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                             .super__Head_base<0UL,_tchecker::algorithms::reach::stats_t,_false>.
                             _M_head_impl), *pbVar4 == true)) {
      cex = tchecker::tck_reach::zg_reach::cex::concrete_counter_example
                      (local_98.
                       super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                       .
                       super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                       .
                       super__Head_base<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>,_false>
                       ._M_head_impl.
                       super___shared_ptr<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
      if ((cex->
          super_finite_path_t<tchecker::zg::zg_t,_tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
          ).
          super_finite_path_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
          ._first._t ==
          (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
           *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Unable to compute a concrete counter example");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tchecker::tck_reach::zg_reach::cex::dot_output(os,cex,&sysdecl->_name);
    }
    else {
      if ((certificate != CERTIFICATE_SYMBOLIC) ||
         (pbVar4 = tchecker::algorithms::reach::stats_t::reachable
                             (&local_98.
                               super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                               .super__Head_base<0UL,_tchecker::algorithms::reach::stats_t,_false>.
                               _M_head_impl), *pbVar4 != true)) goto LAB_0012ef6d;
      cex = (concrete_cex_t *)
            tchecker::tck_reach::zg_reach::cex::symbolic_counter_example
                      (local_98.
                       super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                       .
                       super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
                       .
                       super__Head_base<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>,_false>
                       ._M_head_impl.
                       super___shared_ptr<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
      if ((cex->
          super_finite_path_t<tchecker::zg::zg_t,_tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
          ).
          super_finite_path_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
          ._first._t ==
          (make_shared_t<tchecker::graph::reachability::node_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
           *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Unable to compute a symbolic counter example");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tchecker::tck_reach::zg_reach::cex::dot_output(os,(symbolic_cex_t *)cex,&sysdecl->_name);
    }
    (*(cex->
      super_finite_path_t<tchecker::zg::zg_t,_tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
      ).
      super_finite_path_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
      .
      super_multigraph_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>
      ._vptr_multigraph_t[1])(cex);
  }
LAB_0012ef6d:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_98.
      super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
      .super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>.
      super__Head_base<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>,_false>.
      _M_head_impl.
      super___shared_ptr<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.
               super__Tuple_impl<0UL,_tchecker::algorithms::reach::stats_t,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>
               .super__Tuple_impl<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>_>.
               super__Head_base<1UL,_std::shared_ptr<tchecker::tck_reach::zg_reach::graph_t>,_false>
               ._M_head_impl.
               super___shared_ptr<tchecker::tck_reach::zg_reach::graph_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void reach(tchecker::parsing::system_declaration_t const & sysdecl)
{
  auto && [stats, graph] = tchecker::tck_reach::zg_reach::run(sysdecl, labels, search_order, block_size, table_size);

  // stats
  std::map<std::string, std::string> m;
  stats.attributes(m);
  for (auto && [key, value] : m)
    std::cout << key << " " << value << std::endl;

  // certificate
  if (certificate == CERTIFICATE_GRAPH)
    tchecker::tck_reach::zg_reach::dot_output(*os, *graph, sysdecl.name());
  else if ((certificate == CERTIFICATE_CONCRETE) && stats.reachable()) {
    std::unique_ptr<tchecker::tck_reach::zg_reach::cex::concrete_cex_t> cex{
        tchecker::tck_reach::zg_reach::cex::concrete_counter_example(*graph)};
    if (cex->empty())
      throw std::runtime_error("Unable to compute a concrete counter example");
    tchecker::tck_reach::zg_reach::cex::dot_output(*os, *cex, sysdecl.name());
  }
  else if ((certificate == CERTIFICATE_SYMBOLIC) && stats.reachable()) {
    std::unique_ptr<tchecker::tck_reach::zg_reach::cex::symbolic_cex_t> cex{
        tchecker::tck_reach::zg_reach::cex::symbolic_counter_example(*graph)};
    if (cex->empty())
      throw std::runtime_error("Unable to compute a symbolic counter example");
    tchecker::tck_reach::zg_reach::cex::dot_output(*os, *cex, sysdecl.name());
  }
}